

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void nowtech::log::
     Log<nowtech::log::QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>,_nowtech::log::SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>,_(signed_char)'\x02',_(nowtech::log::TaskRepresentation)2,_0UL,_444U>
     ::transmit(MessageQueue *aList)

{
  _List_node_header *p_Var1;
  Iterator pcVar2;
  int in_ECX;
  size_t __n;
  _List_node_base *p_Var3;
  MessageQueue *__range3;
  tConverter converter;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  local_38;
  
  pcVar2 = SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
           ::sBegin;
  local_38.mBegin =
       SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
       ::sBegin;
  local_38.mEnd =
       SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
       ::sEnd;
  p_Var1 = &(aList->
            super__List_base<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
            )._M_impl._M_node;
  p_Var3 = &p_Var1->super__List_node_base;
  while (p_Var3 = ((_List_node_base *)&p_Var3->_M_next)->_M_next,
        (_List_node_header *)p_Var3 != p_Var1) {
    MessageCompact<8ul,true>::
    output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
              ((MessageCompact<8ul,true> *)(p_Var3 + 1),&local_38);
  }
  std::__cxx11::
  list<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>_>
  ::clear(aList);
  if (local_38.mBegin < local_38.mEnd) {
    *local_38.mBegin = '\n';
    local_38.mBegin = local_38.mBegin + 1;
  }
  SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
  ::send((int)pcVar2,local_38.mBegin,__n,in_ECX);
  return;
}

Assistant:

static void transmit(MessageQueue &aList) noexcept {
    auto [begin, end] = tSender::getBuffer();
    tConverter converter(begin, end);
    for(auto &message : aList) {
      message.template output<tConverter>(converter);
    }
    aList.clear();
    converter.terminateSequence();
    tSender::send(begin, converter.end());
  }